

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.c
# Opt level: O2

int mj_effect_pixelate(mj_jpeg_t *m)

{
  undefined8 *puVar1;
  uint uVar2;
  jpeg_component_info *pjVar3;
  JBLOCKROW paJVar4;
  JBLOCKROW paJVar5;
  int iVar6;
  JBLOCKARRAY ppaJVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  iVar6 = 2;
  if ((m != (mj_jpeg_t *)0x0) && (iVar6 = 2, m->coef != (jvirt_barray_ptr *)0x0)) {
    for (lVar11 = 0; lVar11 < (m->cinfo).num_components; lVar11 = lVar11 + 1) {
      pjVar3 = (m->cinfo).comp_info;
      for (uVar12 = 0; uVar12 < pjVar3[lVar11].height_in_blocks; uVar12 = uVar12 + 1) {
        ppaJVar7 = (*((m->cinfo).mem)->access_virt_barray)
                             ((j_common_ptr)m,m->coef[lVar11],uVar12,1,1);
        uVar2 = pjVar3[lVar11].width_in_blocks;
        lVar8 = 0;
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          paJVar4 = *ppaJVar7;
          paJVar5 = paJVar4 + uVar9;
          *(JCOEF *)((long)paJVar5 + 8) = 0;
          *(JCOEF *)((long)paJVar5 + 10) = 0;
          *(JCOEF *)((long)paJVar5 + 0xc) = 0;
          *(JCOEF *)((long)paJVar5 + 0xe) = 0;
          paJVar5 = paJVar4 + uVar9;
          *(JCOEF *)((long)paJVar5 + 2) = 0;
          *(JCOEF *)((long)paJVar5 + 4) = 0;
          *(JCOEF *)((long)paJVar5 + 6) = 0;
          *(JCOEF *)((long)paJVar5 + 8) = 0;
          for (uVar10 = 8; uVar10 < 0x40; uVar10 = uVar10 + 8) {
            puVar1 = (undefined8 *)((long)*paJVar4 + uVar10 * 2 + lVar8);
            *puVar1 = 0;
            puVar1[1] = 0;
          }
          lVar8 = lVar8 + 0x80;
        }
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int mj_effect_pixelate(mj_jpeg_t *m) {
    int                  i, c;
    JDIMENSION           k, l;
    jpeg_component_info *component;
    JBLOCKARRAY          blocks;
    JCOEFPTR             coefs;

    if(m == NULL || m->coef == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    /* Set all the AC coefficients to 0 */
    for(c = 0; c < m->cinfo.num_components; c++) {
        component = &m->cinfo.comp_info[c];

        for(l = 0; l < component->height_in_blocks; l++) {
            blocks = (*m->cinfo.mem->access_virt_barray)((j_common_ptr)&m->cinfo, m->coef[c], l, 1, TRUE);

            for(k = 0; k < component->width_in_blocks; k++) {
                coefs = blocks[0][k];

                coefs[1] = 0;
                coefs[2] = 0;
                coefs[3] = 0;
                coefs[4] = 0;
                coefs[5] = 0;
                coefs[6] = 0;
                coefs[7] = 0;

                for(i = 8; i < DCTSIZE2; i += 8) {
                    coefs[i + 0] = 0;
                    coefs[i + 1] = 0;
                    coefs[i + 2] = 0;
                    coefs[i + 3] = 0;
                    coefs[i + 4] = 0;
                    coefs[i + 5] = 0;
                    coefs[i + 6] = 0;
                    coefs[i + 7] = 0;
                }
            }
        }
    }

    return MJ_OK;
}